

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssdp_device.c
# Opt level: O1

int ServiceShutdown(char *Udn,char *ServType,char *Location,int Duration,int AddressFamily,
                   int PowerState,int SleepPeriod,int RegistrationState)

{
  uint uVar1;
  int iVar2;
  char *__cp;
  char *szReq [1];
  sockaddr_storage __ss;
  char Mil_Usn [180];
  
  __ss.__ss_padding[0x6e] = '\0';
  __ss.__ss_padding[0x6f] = '\0';
  __ss.__ss_padding[0x70] = '\0';
  __ss.__ss_padding[0x71] = '\0';
  __ss.__ss_padding[0x72] = '\0';
  __ss.__ss_padding[0x73] = '\0';
  __ss.__ss_padding[0x74] = '\0';
  __ss.__ss_padding[0x75] = '\0';
  __ss.__ss_align = 0;
  __ss.__ss_padding[0x5e] = '\0';
  __ss.__ss_padding[0x5f] = '\0';
  __ss.__ss_padding[0x60] = '\0';
  __ss.__ss_padding[0x61] = '\0';
  __ss.__ss_padding[0x62] = '\0';
  __ss.__ss_padding[99] = '\0';
  __ss.__ss_padding[100] = '\0';
  __ss.__ss_padding[0x65] = '\0';
  __ss.__ss_padding[0x66] = '\0';
  __ss.__ss_padding[0x67] = '\0';
  __ss.__ss_padding[0x68] = '\0';
  __ss.__ss_padding[0x69] = '\0';
  __ss.__ss_padding[0x6a] = '\0';
  __ss.__ss_padding[0x6b] = '\0';
  __ss.__ss_padding[0x6c] = '\0';
  __ss.__ss_padding[0x6d] = '\0';
  __ss.__ss_padding[0x4e] = '\0';
  __ss.__ss_padding[0x4f] = '\0';
  __ss.__ss_padding[0x50] = '\0';
  __ss.__ss_padding[0x51] = '\0';
  __ss.__ss_padding[0x52] = '\0';
  __ss.__ss_padding[0x53] = '\0';
  __ss.__ss_padding[0x54] = '\0';
  __ss.__ss_padding[0x55] = '\0';
  __ss.__ss_padding[0x56] = '\0';
  __ss.__ss_padding[0x57] = '\0';
  __ss.__ss_padding[0x58] = '\0';
  __ss.__ss_padding[0x59] = '\0';
  __ss.__ss_padding[0x5a] = '\0';
  __ss.__ss_padding[0x5b] = '\0';
  __ss.__ss_padding[0x5c] = '\0';
  __ss.__ss_padding[0x5d] = '\0';
  __ss.__ss_padding[0x3e] = '\0';
  __ss.__ss_padding[0x3f] = '\0';
  __ss.__ss_padding[0x40] = '\0';
  __ss.__ss_padding[0x41] = '\0';
  __ss.__ss_padding[0x42] = '\0';
  __ss.__ss_padding[0x43] = '\0';
  __ss.__ss_padding[0x44] = '\0';
  __ss.__ss_padding[0x45] = '\0';
  __ss.__ss_padding[0x46] = '\0';
  __ss.__ss_padding[0x47] = '\0';
  __ss.__ss_padding[0x48] = '\0';
  __ss.__ss_padding[0x49] = '\0';
  __ss.__ss_padding[0x4a] = '\0';
  __ss.__ss_padding[0x4b] = '\0';
  __ss.__ss_padding[0x4c] = '\0';
  __ss.__ss_padding[0x4d] = '\0';
  __ss.__ss_padding[0x2e] = '\0';
  __ss.__ss_padding[0x2f] = '\0';
  __ss.__ss_padding[0x30] = '\0';
  __ss.__ss_padding[0x31] = '\0';
  __ss.__ss_padding[0x32] = '\0';
  __ss.__ss_padding[0x33] = '\0';
  __ss.__ss_padding[0x34] = '\0';
  __ss.__ss_padding[0x35] = '\0';
  __ss.__ss_padding[0x36] = '\0';
  __ss.__ss_padding[0x37] = '\0';
  __ss.__ss_padding[0x38] = '\0';
  __ss.__ss_padding[0x39] = '\0';
  __ss.__ss_padding[0x3a] = '\0';
  __ss.__ss_padding[0x3b] = '\0';
  __ss.__ss_padding[0x3c] = '\0';
  __ss.__ss_padding[0x3d] = '\0';
  __ss.__ss_padding[0x1e] = '\0';
  __ss.__ss_padding[0x1f] = '\0';
  __ss.__ss_padding[0x20] = '\0';
  __ss.__ss_padding[0x21] = '\0';
  __ss.__ss_padding[0x22] = '\0';
  __ss.__ss_padding[0x23] = '\0';
  __ss.__ss_padding[0x24] = '\0';
  __ss.__ss_padding[0x25] = '\0';
  __ss.__ss_padding[0x26] = '\0';
  __ss.__ss_padding[0x27] = '\0';
  __ss.__ss_padding[0x28] = '\0';
  __ss.__ss_padding[0x29] = '\0';
  __ss.__ss_padding[0x2a] = '\0';
  __ss.__ss_padding[0x2b] = '\0';
  __ss.__ss_padding[0x2c] = '\0';
  __ss.__ss_padding[0x2d] = '\0';
  __ss.__ss_padding[0xe] = '\0';
  __ss.__ss_padding[0xf] = '\0';
  __ss.__ss_padding[0x10] = '\0';
  __ss.__ss_padding[0x11] = '\0';
  __ss.__ss_padding[0x12] = '\0';
  __ss.__ss_padding[0x13] = '\0';
  __ss.__ss_padding[0x14] = '\0';
  __ss.__ss_padding[0x15] = '\0';
  __ss.__ss_padding[0x16] = '\0';
  __ss.__ss_padding[0x17] = '\0';
  __ss.__ss_padding[0x18] = '\0';
  __ss.__ss_padding[0x19] = '\0';
  __ss.__ss_padding[0x1a] = '\0';
  __ss.__ss_padding[0x1b] = '\0';
  __ss.__ss_padding[0x1c] = '\0';
  __ss.__ss_padding[0x1d] = '\0';
  __ss.ss_family = 0;
  __ss.__ss_padding[0] = '\0';
  __ss.__ss_padding[1] = '\0';
  __ss.__ss_padding[2] = '\0';
  __ss.__ss_padding[3] = '\0';
  __ss.__ss_padding[4] = '\0';
  __ss.__ss_padding[5] = '\0';
  __ss.__ss_padding[6] = '\0';
  __ss.__ss_padding[7] = '\0';
  __ss.__ss_padding[8] = '\0';
  __ss.__ss_padding[9] = '\0';
  __ss.__ss_padding[10] = '\0';
  __ss.__ss_padding[0xb] = '\0';
  __ss.__ss_padding[0xc] = '\0';
  __ss.__ss_padding[0xd] = '\0';
  szReq[0] = (char *)0x0;
  if (AddressFamily == 10) {
    __ss.ss_family = 10;
    __ss.__ss_padding[0] = '\0';
    __ss.__ss_padding[1] = '\0';
    __ss.__ss_padding[2] = '\0';
    __ss.__ss_padding[3] = '\0';
    __ss.__ss_padding[4] = '\0';
    __ss.__ss_padding[5] = '\0';
    iVar2 = isUrlV6UlaGua(Location);
    __cp = "FF05::C";
    if (iVar2 == 0) {
      __cp = "FF02::C";
    }
    inet_pton(10,__cp,__ss.__ss_padding + 6);
    __ss.__ss_padding[0] = '\a';
    __ss.__ss_padding[1] = 'l';
    __ss.__ss_padding[0x16] = (undefined1)gIF_INDEX;
    __ss.__ss_padding[0x17] = gIF_INDEX._1_1_;
    __ss.__ss_padding[0x18] = gIF_INDEX._2_1_;
    __ss.__ss_padding[0x19] = gIF_INDEX._3_1_;
  }
  else if (AddressFamily == 2) {
    __ss.ss_family = 2;
    __ss.__ss_padding[0] = '\0';
    __ss.__ss_padding[1] = '\0';
    __ss.__ss_padding[2] = '\0';
    __ss.__ss_padding[3] = '\0';
    __ss.__ss_padding[4] = '\0';
    __ss.__ss_padding[5] = '\0';
    inet_pton(2,"239.255.255.250",__ss.__ss_padding + 2);
    __ss.__ss_padding[0] = '\a';
    __ss.__ss_padding[1] = 'l';
  }
  else {
    UpnpPrintf(UPNP_CRITICAL,SSDP,".upnp/src/ssdp/ssdp_device.c",0x4c1,
               "Invalid device address family.\n");
  }
  uVar1 = snprintf(Mil_Usn,0xb4,"%s::%s",Udn,ServType);
  iVar2 = -0x68;
  if (uVar1 < 0xb4) {
    CreateServicePacket(0,ServType,Mil_Usn,Location,Duration,szReq,AddressFamily,PowerState,
                        SleepPeriod,RegistrationState);
    if (szReq[0] != (char *)0x0) {
      iVar2 = NewRequestHandler((sockaddr *)&__ss,1,szReq);
    }
  }
  free(szReq[0]);
  return iVar2;
}

Assistant:

int ServiceShutdown(char *Udn,
	char *ServType,
	char *Location,
	int Duration,
	int AddressFamily,
	int PowerState,
	int SleepPeriod,
	int RegistrationState)
{
	char Mil_Usn[LINE_SIZE];
	char *szReq[1];
	struct sockaddr_storage __ss;
	struct sockaddr_in *DestAddr4 = (struct sockaddr_in *)&__ss;
	struct sockaddr_in6 *DestAddr6 = (struct sockaddr_in6 *)&__ss;
	int RetVal = UPNP_E_OUTOF_MEMORY;
	int rc = 0;

	memset(&__ss, 0, sizeof(__ss));
	szReq[0] = NULL;
	switch (AddressFamily) {
	case AF_INET:
		DestAddr4->sin_family = (sa_family_t)AddressFamily;
		inet_pton(AF_INET, SSDP_IP, &DestAddr4->sin_addr);
		DestAddr4->sin_port = htons(SSDP_PORT);
		break;
	case AF_INET6:
		DestAddr6->sin6_family = (sa_family_t)AddressFamily;
		inet_pton(AF_INET6,
			(isUrlV6UlaGua(Location)) ? SSDP_IPV6_SITELOCAL
						  : SSDP_IPV6_LINKLOCAL,
			&DestAddr6->sin6_addr);
		DestAddr6->sin6_port = htons(SSDP_PORT);
		DestAddr6->sin6_scope_id = gIF_INDEX;
		break;
	default:
		UpnpPrintf(UPNP_CRITICAL,
			SSDP,
			__FILE__,
			__LINE__,
			"Invalid device address family.\n");
	}
	/* sprintf(Mil_Nt,"%s",ServType); */
	rc = snprintf(Mil_Usn, sizeof(Mil_Usn), "%s::%s", Udn, ServType);
	if (rc < 0 || (unsigned int)rc >= sizeof(Mil_Usn))
		goto error_handler;
	/* CreateServiceRequestPacket(0,szReq[0],Mil_Nt,Mil_Usn,
	 * Server,Location,Duration); */
	CreateServicePacket(MSGTYPE_SHUTDOWN,
		ServType,
		Mil_Usn,
		Location,
		Duration,
		&szReq[0],
		AddressFamily,
		PowerState,
		SleepPeriod,
		RegistrationState);
	if (szReq[0] == NULL)
		goto error_handler;
	RetVal = NewRequestHandler((struct sockaddr *)&__ss, 1, szReq);

error_handler:
	free(szReq[0]);

	return RetVal;
}